

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLdimacs.c
# Opt level: O1

RDL_DimacsGraph * RDL_dimacsGraph_read(char *filename)

{
  RDL_node RVar1;
  RDL_node RVar2;
  bool bVar3;
  int iVar4;
  FILE *__stream;
  RDL_DimacsGraph *graph;
  char *pcVar5;
  size_t sVar6;
  RDL_edge *paRVar7;
  RDL_cycle **ppRVar8;
  RDL_cycle *pRVar9;
  char **ppcVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  uint node2;
  uint ring;
  uint node1;
  uint ring_size;
  char line [257];
  int local_174;
  uint local_170;
  RDL_node local_16c;
  uint local_168;
  uint local_164;
  uint local_160;
  uint local_15c;
  ulong local_158;
  uint *local_150;
  uint *local_148;
  uint *local_140;
  byte local_138 [2];
  char local_136 [262];
  
  local_15c = 0;
  __stream = fopen(filename,"r");
  uVar13 = 0;
  if (__stream == (FILE *)0x0) {
    graph = (RDL_DimacsGraph *)0x0;
  }
  else {
    graph = (RDL_DimacsGraph *)malloc(0x30);
    local_150 = &graph->nof_cycles;
    graph->nof_cycles = 0;
    graph->name = (char *)0x0;
    graph->edges = (RDL_edge *)0x0;
    graph->cycles = (RDL_cycle **)0x0;
    graph->sorted_cycles = (char **)0x0;
    pcVar5 = fgets((char *)local_138,0x100,__stream);
    if (pcVar5 == (char *)0x0) {
      bVar3 = true;
      local_160 = 0;
      local_170 = 0;
      local_158 = 0;
    }
    else {
      local_140 = &graph->nof_nodes;
      local_148 = &graph->nof_edges;
      bVar16 = false;
      local_158 = 0;
      local_170 = 0;
      local_160 = 0;
      uVar12 = 0;
      local_174 = 0;
      do {
        if (local_138[0] < 0x70) {
          if (local_138[0] != 99) {
            if (local_138[0] != 0x65) {
LAB_0010bc27:
              pcVar5 = "invalid line!\n";
              goto LAB_0010bdd7;
            }
            if (local_174 != 1) {
              pcVar5 = "edge \'e\' found without \'p\' definition!\n";
              goto LAB_0010bdd7;
            }
            iVar4 = __isoc99_sscanf(local_138,"e %u %u",&local_164,&local_16c);
            if (iVar4 == 0) {
              pcVar5 = "invalid edge specification line\n";
            }
            else if ((uint)uVar12 == graph->nof_edges) {
              pcVar5 = "too many edges found!\n";
            }
            else {
              if (((local_164 != 0) && (local_164 <= graph->nof_nodes)) &&
                 (local_16c - 1 < graph->nof_nodes)) {
                paRVar7 = graph->edges;
                paRVar7[uVar12][0] = local_164;
                paRVar7[uVar12][1] = local_16c;
                uVar12 = (ulong)((uint)uVar12 + 1);
                goto LAB_0010be6a;
              }
              pcVar5 = "illegal edge specification!\n";
            }
LAB_0010be91:
            (*RDL_outputFunc)(RDL_ERROR,pcVar5);
            local_174 = 1;
            goto LAB_0010bddc;
          }
          sVar6 = strlen((char *)local_138);
          if ((sVar6 & 0xfffffffc) != 0 && graph->name == (char *)0x0) {
            pcVar5 = (char *)malloc((ulong)((int)sVar6 - 2));
            graph->name = pcVar5;
            uVar15 = (ulong)((int)sVar6 - 3);
            strncpy(pcVar5,local_136,uVar15);
            pcVar5[uVar15] = '\0';
          }
        }
        else {
          if (local_138[0] == 0x72) {
            if (local_174 == 0) {
              local_174 = 0;
              pcVar5 = "ring \'r\' found without \'p\' definition!\n";
            }
            else if (graph->cycles == (RDL_cycle **)0x0) {
              pcVar5 = "ring \'r\' found without \'p\' definition for rings!\n";
            }
            else {
              iVar4 = __isoc99_sscanf(local_138,"r %u %u %u %u",&local_168,&local_15c,&local_164,
                                      &local_16c);
              if (iVar4 == 4) {
                if ((local_168 == 0) || (*local_150 < local_168)) {
                  local_174 = 2;
                  (*RDL_outputFunc)(RDL_ERROR,"invalid ring counter \'%u\'!\n");
                  goto LAB_0010bddc;
                }
                if (((local_164 == 0) || (graph->nof_nodes < local_164)) ||
                   (graph->nof_nodes <= local_16c - 1)) {
                  local_174 = 2;
                  pcVar5 = "illegal edge specification!\n";
                }
                else {
                  uVar13 = (uint)local_158;
                  if (local_168 != uVar13) {
                    if (uVar13 != 0) {
                      if (local_170 == graph->cycles[uVar13 - 1]->weight) {
                        if (local_168 == uVar13 + 1) goto LAB_0010bf55;
                        (*RDL_outputFunc)(RDL_ERROR,
                                          "rings have to be continuous, \'%u\' follows on \'%u\'",
                                          (ulong)local_168,local_158 & 0xffffffff);
                      }
                      else {
                        (*RDL_outputFunc)(RDL_ERROR,"last ring %u wasn\'t filled up!\n",
                                          local_158 & 0xffffffff);
                      }
                      bVar16 = true;
                    }
LAB_0010bf55:
                    pRVar9 = (RDL_cycle *)malloc(0x18);
                    local_158 = (ulong)local_168;
                    graph->cycles[local_168 - 1] = pRVar9;
                    pRVar9 = graph->cycles[local_168 - 1];
                    pRVar9->weight = local_15c;
                    paRVar7 = (RDL_edge *)malloc((ulong)local_15c << 3);
                    pRVar9->edges = paRVar7;
                    local_160 = local_160 + 1;
                    local_170 = 0;
                  }
                  ppRVar8 = graph->cycles;
                  pRVar9 = ppRVar8[local_168 - 1];
                  if (local_170 != pRVar9->weight) {
                    pRVar9->edges[local_170][0] = local_164;
                    ppRVar8[local_168 - 1]->edges[local_170][1] = local_16c;
                    local_170 = local_170 + 1;
                    local_174 = 2;
                    goto LAB_0010bde2;
                  }
                  local_174 = 2;
                  pcVar5 = "too many edges for ring!\n";
                }
              }
              else {
                local_174 = 2;
                pcVar5 = "invalid ring specification line\n";
              }
            }
          }
          else {
            if (local_138[0] != 0x70) goto LAB_0010bc27;
            if (local_174 == 0) {
              iVar4 = __isoc99_sscanf(local_138,"p edge %u %u %u",local_140,local_148);
              if (iVar4 == 2) {
                paRVar7 = (RDL_edge *)malloc((ulong)graph->nof_edges << 3);
                graph->edges = paRVar7;
                graph->nof_cycles = 0xffffffff;
                graph->cycles = (RDL_cycle **)0x0;
              }
              else {
                if (iVar4 != 3) {
                  pcVar5 = "invalid line starting with \'p\'\n";
                  goto LAB_0010be91;
                }
                paRVar7 = (RDL_edge *)malloc((ulong)graph->nof_edges << 3);
                graph->edges = paRVar7;
                sVar6 = (ulong)graph->nof_cycles << 3;
                ppRVar8 = (RDL_cycle **)malloc(sVar6);
                graph->cycles = ppRVar8;
                memset(ppRVar8,0,sVar6);
              }
LAB_0010be6a:
              local_174 = 1;
              goto LAB_0010bde2;
            }
            pcVar5 = "duplicate \'p\' line found!\n";
          }
LAB_0010bdd7:
          (*RDL_outputFunc)(RDL_ERROR,pcVar5);
LAB_0010bddc:
          bVar16 = true;
        }
LAB_0010bde2:
        uVar13 = (uint)uVar12;
        pcVar5 = fgets((char *)local_138,0x100,__stream);
        bVar3 = !bVar16;
      } while ((pcVar5 != (char *)0x0) && (!bVar16));
    }
    bVar16 = true;
    if (bVar3) {
      bVar16 = false;
      if (*local_150 != 0xffffffff) {
        bVar16 = local_160 != *local_150;
        if (bVar16) {
          (*RDL_outputFunc)(RDL_ERROR,"mismatch between number of cycles!\n");
        }
        if (((int)local_158 != 0) && (local_170 != graph->cycles[(int)local_158 - 1]->weight)) {
          (*RDL_outputFunc)(RDL_ERROR,"last ring %u wasn\'t filled up!\n");
          bVar16 = true;
        }
      }
    }
    if (bVar16) {
      bVar3 = false;
    }
    else {
      bVar3 = true;
      if (uVar13 != graph->nof_edges) {
        bVar3 = false;
        (*RDL_outputFunc)(RDL_ERROR,"mismatch between number of edges!\n");
      }
    }
    if (!bVar3) {
      RDL_dimacsGraph_delete(graph);
      graph = (RDL_DimacsGraph *)0x0;
    }
    fclose(__stream);
    if (bVar3) {
      if (graph->cycles == (RDL_cycle **)0x0) {
        graph->sorted_cycles = (char **)0x0;
      }
      else {
        sVar6 = (size_t)graph->nof_cycles;
        ppcVar10 = (char **)malloc(sVar6 * 8);
        graph->sorted_cycles = ppcVar10;
        if (sVar6 != 0) {
          uVar12 = 0xffffffff;
          uVar15 = 0;
          do {
            uVar13 = graph->nof_edges;
            pcVar5 = (char *)malloc((ulong)(uVar13 + 1));
            graph->sorted_cycles[uVar15] = pcVar5;
            memset(graph->sorted_cycles[uVar15],0,(ulong)uVar13);
            graph->sorted_cycles[uVar15][graph->nof_edges] = '\x02';
            pRVar9 = graph->cycles[uVar15];
            if (pRVar9->weight != 0) {
              uVar11 = 0;
              do {
                if ((ulong)graph->nof_edges != 0) {
                  RVar1 = pRVar9->edges[uVar11][0];
                  RVar2 = pRVar9->edges[uVar11][1];
                  paRVar7 = graph->edges;
                  uVar14 = 0;
                  do {
                    if (((paRVar7[uVar14][0] == RVar1) && (paRVar7[uVar14][1] == RVar2)) ||
                       ((paRVar7[uVar14][0] == RVar2 && (paRVar7[uVar14][1] == RVar1)))) {
                      uVar12 = uVar14 & 0xffffffff;
                    }
                    uVar14 = uVar14 + 1;
                  } while (graph->nof_edges != uVar14);
                }
                graph->sorted_cycles[uVar15][(int)uVar12] = '\x01';
                uVar11 = uVar11 + 1;
                pRVar9 = graph->cycles[uVar15];
              } while (uVar11 < pRVar9->weight);
            }
            uVar15 = uVar15 + 1;
            sVar6 = (size_t)graph->nof_cycles;
          } while (uVar15 < sVar6);
        }
        qsort(graph->sorted_cycles,sVar6,8,RDL_cmp_cycles);
      }
    }
  }
  return graph;
}

Assistant:

RDL_DimacsGraph* RDL_dimacsGraph_read(const char* filename)
{
  FILE* infile;
  RDL_DimacsGraph* graph = NULL;
  char line[RDL_MAXSIZE + 1];
  unsigned node1, node2, ring;
  int error = 0;
  int stage = 0;
  unsigned edge_counter = 0;
  unsigned ring_counter = 0;
  unsigned ring_position_counter = 0;
  unsigned last_ring = 0;
  unsigned ring_size = 0;
  unsigned ring_idx, edge_idx;
  unsigned eidx;
  int found_eidx = -1;
  int read_initializer = -1;
  unsigned len;
  RDL_edge edge;

  infile = fopen(filename, "r");

  if (!infile) {
    return graph;
  }

  graph = malloc(sizeof(*graph));
  graph->nof_cycles = 0;
  graph->edges = NULL;
  graph->cycles = NULL;
  graph->sorted_cycles = NULL;
  graph->name = NULL;

  while (fgets(line, RDL_MAXSIZE, infile) && !error) {
    if (line[0] == 'p') {
      if (!stage) {
        stage = 1;

        read_initializer = sscanf(line, "p edge %u %u %u", &graph->nof_nodes, &graph->nof_edges, &graph->nof_cycles);
        if (read_initializer == 3) {
          graph->edges = malloc(graph->nof_edges * sizeof(*graph->edges));
          graph->cycles = malloc(graph->nof_cycles * sizeof(*graph->cycles));
          memset(graph->cycles, 0, graph->nof_cycles * sizeof(*graph->cycles));
        }
        else if (read_initializer == 2) {
          graph->edges = malloc(graph->nof_edges * sizeof(*graph->edges));
          graph->nof_cycles = UINT_MAX;
          graph->cycles = NULL;
        }
        else {
          RDL_outputFunc(RDL_ERROR, "invalid line starting with 'p'\n");
          error = 1;
        }
      }
      else {
        RDL_outputFunc(RDL_ERROR, "duplicate 'p' line found!\n");
        error = 1;
      }
    }
    else if (line[0] == 'e') {
      if (stage != 1) {
        RDL_outputFunc(RDL_ERROR, "edge 'e' found without 'p' definition!\n");
        error = 1;
      }
      else {
        if (!sscanf(line, "e %u %u", &node1, &node2)) {
          RDL_outputFunc(RDL_ERROR, "invalid edge specification line\n");
          error = 1;
        }
        else if (edge_counter == graph->nof_edges) {
          RDL_outputFunc(RDL_ERROR, "too many edges found!\n");
          error = 1;
        }
        else if (node1 < 1 || node1 > graph->nof_nodes || node2 < 1 || node2 > graph->nof_nodes) {
          RDL_outputFunc(RDL_ERROR, "illegal edge specification!\n");
          error = 1;
        }
        else {
          graph->edges[edge_counter][0] = node1;
          graph->edges[edge_counter][1] = node2;
          ++edge_counter;
        }
      }
    }
    else if (line[0] == 'r') {
      if (!stage) {
        RDL_outputFunc(RDL_ERROR, "ring 'r' found without 'p' definition!\n");
        error = 1;
      }
      else if (!graph->cycles) {
        RDL_outputFunc(RDL_ERROR, "ring 'r' found without 'p' definition for rings!\n");
        error = 1;
      }
      else {
        stage = 2;
        if (sscanf(line, "r %u %u %u %u", &ring, &ring_size, &node1, &node2) != 4) {
          RDL_outputFunc(RDL_ERROR, "invalid ring specification line\n");
          error = 1;
        }
        else if (ring < 1|| ring > graph->nof_cycles) {
          RDL_outputFunc(RDL_ERROR, "invalid ring counter '%u'!\n", ring);
          error = 1;
        }
        else if (node1 < 1 || node1 > graph->nof_nodes || node2 < 1 || node2 > graph->nof_nodes) {
          RDL_outputFunc(RDL_ERROR, "illegal edge specification!\n");
          error = 1;
        }
        else {
          if (ring != last_ring) {
            if (last_ring) {
              if (ring_position_counter != graph->cycles[last_ring-1]->weight) {
                RDL_outputFunc(RDL_ERROR, "last ring %u wasn't filled up!\n", last_ring);
                error = 1;
              }
              else if (ring != last_ring + 1) {
                RDL_outputFunc(RDL_ERROR, "rings have to be continuous, '%u' follows on '%u'", ring, last_ring);
                error = 1;
              }
            }

            ring_position_counter = 0;
            graph->cycles[ring-1] = malloc(sizeof(**graph->cycles));
            graph->cycles[ring-1]->weight = ring_size;
            graph->cycles[ring-1]->edges = malloc(ring_size * sizeof(*graph->cycles[ring-1]->edges));
            last_ring = ring;
            ++ring_counter;
          }

          if (ring_position_counter == graph->cycles[ring-1]->weight) {
            RDL_outputFunc(RDL_ERROR, "too many edges for ring!\n");
            error = 1;
          }
          else {
            graph->cycles[ring-1]->edges[ring_position_counter][0] = node1;
            graph->cycles[ring-1]->edges[ring_position_counter][1] = node2;
            ++ring_position_counter;
          }
        }
      }
    }
    else if (line[0] == 'c') {
      len = strlen(line);
      if (!graph->name && len > 3) {
        /* skip first two characters (but reserve +1 for \0 and -1 for the newline) */
        graph->name = malloc((len - 2) * sizeof(*graph->name));
        strncpy(graph->name, line + 2, len - 3);
        graph->name[len - 3] = '\0';
      }
    }
    else {
      RDL_outputFunc(RDL_ERROR, "invalid line!\n");
      error = 1;
    }
  }

  if (!error && graph->nof_cycles != UINT_MAX) {
    if (ring_counter != graph->nof_cycles) {
      RDL_outputFunc(RDL_ERROR, "mismatch between number of cycles!\n");
      error = 1;
    }

    if (last_ring) {
      if (ring_position_counter != graph->cycles[last_ring-1]->weight) {
        RDL_outputFunc(RDL_ERROR, "last ring %u wasn't filled up!\n", last_ring);
        error = 1;
      }
    }
  }

  if (!error && edge_counter != graph->nof_edges) {
    RDL_outputFunc(RDL_ERROR, "mismatch between number of edges!\n");
    error = 1;
  }

  if (error && graph) {
    RDL_dimacsGraph_delete(graph);
    graph = NULL;
  }

  fclose(infile);

  if (!error) {
    if (graph->cycles) {
      graph->sorted_cycles = malloc(graph->nof_cycles * sizeof(*graph->sorted_cycles));
      for (ring_idx = 0; ring_idx < graph->nof_cycles; ++ring_idx) {
        graph->sorted_cycles[ring_idx] = malloc((graph->nof_edges + 1) * sizeof(**graph->sorted_cycles));
        memset(graph->sorted_cycles[ring_idx], 0, graph->nof_edges * sizeof(**graph->sorted_cycles));
        graph->sorted_cycles[ring_idx][graph->nof_edges] = 2;
        for (edge_idx = 0; edge_idx < graph->cycles[ring_idx]->weight; ++edge_idx) {
          edge[0] = graph->cycles[ring_idx]->edges[edge_idx][0];
          edge[1] = graph->cycles[ring_idx]->edges[edge_idx][1];
          for (eidx = 0; eidx < graph->nof_edges; ++eidx) {
            if ((graph->edges[eidx][0] == edge[0]&& graph->edges[eidx][1] == edge[1])
                || (graph->edges[eidx][0] == edge[1] && graph->edges[eidx][1] == edge[0])) {
              found_eidx = eidx;
            }
          }
          graph->sorted_cycles[ring_idx][found_eidx] = 1;
        }
      }

      qsort(graph->sorted_cycles, graph->nof_cycles, sizeof(*graph->sorted_cycles), RDL_cmp_cycles);
    }
    else {
      graph->sorted_cycles = NULL;
    }
  }

  return graph;
}